

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall argo::json::json(json *this,type t,string *raw_value)

{
  json_exception *this_00;
  char *json_type_name;
  string *raw_value_local;
  type t_local;
  json *this_local;
  
  this->m_type = t;
  json_value::json_value((json_value *)&(this->m_value).u_object);
  std::__cxx11::string::string((string *)&this->m_raw_value,(string *)raw_value);
  if (((t != string_e) && (t != number_int_e)) && (t != number_double_e)) {
    this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
    json_type_name = get_instance_type_name(this);
    json_exception::json_exception(this_00,not_number_or_string_e,json_type_name);
    __cxa_throw(this_00,&json_exception::typeinfo,json_exception::~json_exception);
  }
  if (t == string_e) {
    construct_string(this);
  }
  return;
}

Assistant:

json::json(type t, const string &raw_value) : m_type(t), m_raw_value(raw_value)
{
    if (t != string_e && t != number_int_e && t != number_double_e)
    {
        throw json_exception(json_exception::not_number_or_string_e, get_instance_type_name());
    }

    if (t == string_e)
    {
        construct_string();
    }
}